

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_write_state.cpp
# Opt level: O2

void __thiscall
duckdb::WALWriteState::WriteCatalogEntry(WALWriteState *this,CatalogEntry *entry,data_ptr_t dataptr)

{
  CatalogType CVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  CatalogEntry *pCVar2;
  IndexCatalogEntry *entry_00;
  AlterInfo *info;
  InternalException *pIVar3;
  ulong uVar4;
  uint uVar5;
  pointer *__ptr;
  undefined1 local_308 [8];
  MemoryStream source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_name;
  BinaryDeserializer deserializer;
  
  if (entry->temporary != false) {
    return;
  }
  pCVar2 = CatalogEntry::Parent(entry);
  if (pCVar2->temporary != false) {
    return;
  }
  entry_00 = (IndexCatalogEntry *)CatalogEntry::Parent(entry);
  CVar1 = (entry_00->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type;
  uVar4 = (ulong)CVar1;
  if (uVar4 < 0x35) {
    if ((0x1000003e0000a0U >> (uVar4 & 0x3f) & 1) != 0) {
      return;
    }
    if ((0xc0000158UL >> (uVar4 & 0x3f) & 1) != 0) goto LAB_015a6ad7;
    if (uVar4 == 0x33) {
      CVar1 = entry->type;
      switch(CVar1) {
      case TABLE_ENTRY:
        WriteAheadLog::WriteDropTable(this->log,(TableCatalogEntry *)entry);
        return;
      case SCHEMA_ENTRY:
        WriteAheadLog::WriteDropSchema(this->log,(SchemaCatalogEntry *)entry);
        return;
      case VIEW_ENTRY:
        WriteAheadLog::WriteDropView(this->log,(ViewCatalogEntry *)entry);
        return;
      case INDEX_ENTRY:
        WriteAheadLog::WriteDropIndex(this->log,(IndexCatalogEntry *)entry);
        return;
      case PREPARED_STATEMENT:
        return;
      case SEQUENCE_ENTRY:
        WriteAheadLog::WriteDropSequence(this->log,(SequenceCatalogEntry *)entry);
        return;
      case COLLATION_ENTRY:
        goto switchD_015a6d90_caseD_7;
      case TYPE_ENTRY:
        WriteAheadLog::WriteDropType(this->log,(TypeCatalogEntry *)entry);
        return;
      default:
        uVar4 = (ulong)(CVar1 - 0x1a);
        if (CVar1 - 0x1a < 0x30) {
          if ((0xe00004000001U >> (uVar4 & 0x3f) & 1) != 0) {
            return;
          }
          if (uVar4 == 4) {
            WriteAheadLog::WriteDropMacro(this->log,(ScalarMacroCatalogEntry *)entry);
            return;
          }
          if (uVar4 == 5) {
            WriteAheadLog::WriteDropTableMacro(this->log,(TableMacroCatalogEntry *)entry);
            return;
          }
        }
        if (CVar1 == DEPENDENCY_ENTRY) {
          return;
        }
switchD_015a6d90_caseD_7:
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&deserializer,"Don\'t know how to drop this type!",(allocator *)&source
                  );
        InternalException::InternalException(pIVar3,(string *)&deserializer);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  if ((CVar1 - 0x47 < 0x1e) && ((0x20000007U >> (CVar1 - 0x47 & 0x1f) & 1) != 0)) {
    return;
  }
  if (CVar1 == SCHEMA_ENTRY) {
    if (entry->type == SCHEMA_ENTRY) {
      return;
    }
    if (entry->type == RENAMED_ENTRY) {
      return;
    }
    WriteAheadLog::WriteCreateSchema(this->log,(SchemaCatalogEntry *)entry_00);
    return;
  }
  if (CVar1 != TABLE_ENTRY) {
    pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&deserializer,"UndoBuffer - don\'t know how to write this entry to the WAL"
               ,(allocator *)&source);
    InternalException::InternalException(pIVar3,(string *)&deserializer);
    __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_015a6ad7:
  if ((entry->type == RENAMED_ENTRY) || (entry->type == CVar1)) {
    MemoryStream::MemoryStream(&source,dataptr + 8,*(idx_t *)dataptr);
    BinaryDeserializer::BinaryDeserializer(&deserializer,&source.super_ReadStream);
    BinaryDeserializer::OnObjectBegin(&deserializer);
    Deserializer::ReadProperty<std::__cxx11::string>
              (&column_name,&deserializer.super_Deserializer,100,"column_name");
    Deserializer::
    ReadProperty<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
              ((Deserializer *)local_308,(field_id_t)&deserializer,(char *)0x65);
    BinaryDeserializer::OnObjectEnd(&deserializer);
    info = (AlterInfo *)
           unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::operator->
                     ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *
                      )local_308);
    WriteAheadLog::WriteAlter(this->log,entry,info);
    if ((_Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>)local_308 !=
        (ParseInfo *)0x0) {
      (**(code **)(*(_func_int **)local_308 + 8))();
    }
    ::std::__cxx11::string::~string((string *)&column_name);
    Deserializer::~Deserializer(&deserializer.super_Deserializer);
    MemoryStream::~MemoryStream(&source);
    return;
  }
  uVar5 = CVar1 - 1;
  if (uVar5 < 8) {
    switch((uint)CVar1) {
    case 1:
      UNRECOVERED_JUMPTABLE = this->log->_vptr_WriteAheadLog[2];
      (*UNRECOVERED_JUMPTABLE)
                (this->log,entry_00,
                 (long)&switchD_015a6afe::switchdataD_0200734c +
                 (long)(int)(&switchD_015a6afe::switchdataD_0200734c)[uVar5],UNRECOVERED_JUMPTABLE);
      return;
    case 3:
      WriteAheadLog::WriteCreateView(this->log,(ViewCatalogEntry *)entry_00);
      return;
    case 4:
      WriteAheadLog::WriteCreateIndex(this->log,entry_00);
      return;
    case 6:
      WriteAheadLog::WriteCreateSequence(this->log,(SequenceCatalogEntry *)entry_00);
      return;
    case 8:
      WriteAheadLog::WriteCreateType(this->log,(TypeCatalogEntry *)entry_00);
      return;
    }
  }
  else {
    if (CVar1 == MACRO_ENTRY) {
      WriteAheadLog::WriteCreateMacro(this->log,(ScalarMacroCatalogEntry *)entry_00);
      return;
    }
    if (CVar1 == TABLE_MACRO_ENTRY) {
      WriteAheadLog::WriteCreateTableMacro(this->log,(TableMacroCatalogEntry *)entry_00);
      return;
    }
  }
  pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&deserializer,"Don\'t know how to create this type!",(allocator *)&source);
  InternalException::InternalException(pIVar3,(string *)&deserializer);
  __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void WALWriteState::WriteCatalogEntry(CatalogEntry &entry, data_ptr_t dataptr) {
	if (entry.temporary || entry.Parent().temporary) {
		return;
	}

	// look at the type of the parent entry
	auto &parent = entry.Parent();

	switch (parent.type) {
	case CatalogType::TABLE_ENTRY:
	case CatalogType::VIEW_ENTRY:
	case CatalogType::INDEX_ENTRY:
	case CatalogType::SEQUENCE_ENTRY:
	case CatalogType::TYPE_ENTRY:
	case CatalogType::MACRO_ENTRY:
	case CatalogType::TABLE_MACRO_ENTRY:
		if (entry.type == CatalogType::RENAMED_ENTRY || entry.type == parent.type) {
			// ALTER statement, read the extra data after the entry
			auto extra_data_size = Load<idx_t>(dataptr);
			auto extra_data = data_ptr_cast(dataptr + sizeof(idx_t));

			MemoryStream source(extra_data, extra_data_size);
			BinaryDeserializer deserializer(source);
			deserializer.Begin();
			auto column_name = deserializer.ReadProperty<string>(100, "column_name");
			auto parse_info = deserializer.ReadProperty<unique_ptr<ParseInfo>>(101, "alter_info");
			deserializer.End();

			auto &alter_info = parse_info->Cast<AlterInfo>();
			log.WriteAlter(entry, alter_info);
		} else {
			switch (parent.type) {
			case CatalogType::TABLE_ENTRY:
				// CREATE TABLE statement
				log.WriteCreateTable(parent.Cast<TableCatalogEntry>());
				break;
			case CatalogType::VIEW_ENTRY:
				// CREATE VIEW statement
				log.WriteCreateView(parent.Cast<ViewCatalogEntry>());
				break;
			case CatalogType::INDEX_ENTRY:
				// CREATE INDEX statement
				log.WriteCreateIndex(parent.Cast<IndexCatalogEntry>());
				break;
			case CatalogType::SEQUENCE_ENTRY:
				// CREATE SEQUENCE statement
				log.WriteCreateSequence(parent.Cast<SequenceCatalogEntry>());
				break;
			case CatalogType::TYPE_ENTRY:
				// CREATE TYPE statement
				log.WriteCreateType(parent.Cast<TypeCatalogEntry>());
				break;
			case CatalogType::MACRO_ENTRY:
				log.WriteCreateMacro(parent.Cast<ScalarMacroCatalogEntry>());
				break;
			case CatalogType::TABLE_MACRO_ENTRY:
				log.WriteCreateTableMacro(parent.Cast<TableMacroCatalogEntry>());
				break;
			default:
				throw InternalException("Don't know how to create this type!");
			}
		}
		break;
	case CatalogType::SCHEMA_ENTRY:
		if (entry.type == CatalogType::RENAMED_ENTRY || entry.type == CatalogType::SCHEMA_ENTRY) {
			// ALTER TABLE statement, skip it
			return;
		}
		log.WriteCreateSchema(parent.Cast<SchemaCatalogEntry>());
		break;
	case CatalogType::RENAMED_ENTRY:
		// This is a rename, nothing needs to be done for this
		break;
	case CatalogType::DELETED_ENTRY:
		switch (entry.type) {
		case CatalogType::TABLE_ENTRY: {
			auto &table_entry = entry.Cast<DuckTableEntry>();
			D_ASSERT(table_entry.IsDuckTable());
			log.WriteDropTable(table_entry);
			break;
		}
		case CatalogType::SCHEMA_ENTRY:
			log.WriteDropSchema(entry.Cast<SchemaCatalogEntry>());
			break;
		case CatalogType::VIEW_ENTRY:
			log.WriteDropView(entry.Cast<ViewCatalogEntry>());
			break;
		case CatalogType::SEQUENCE_ENTRY:
			log.WriteDropSequence(entry.Cast<SequenceCatalogEntry>());
			break;
		case CatalogType::MACRO_ENTRY:
			log.WriteDropMacro(entry.Cast<ScalarMacroCatalogEntry>());
			break;
		case CatalogType::TABLE_MACRO_ENTRY:
			log.WriteDropTableMacro(entry.Cast<TableMacroCatalogEntry>());
			break;
		case CatalogType::TYPE_ENTRY:
			log.WriteDropType(entry.Cast<TypeCatalogEntry>());
			break;
		case CatalogType::INDEX_ENTRY: {
			log.WriteDropIndex(entry.Cast<IndexCatalogEntry>());
			break;
		}
		case CatalogType::RENAMED_ENTRY:
		case CatalogType::PREPARED_STATEMENT:
		case CatalogType::SCALAR_FUNCTION_ENTRY:
		case CatalogType::DEPENDENCY_ENTRY:
		case CatalogType::SECRET_ENTRY:
		case CatalogType::SECRET_TYPE_ENTRY:
		case CatalogType::SECRET_FUNCTION_ENTRY:
			// do nothing, prepared statements and scalar functions aren't persisted to disk
			break;
		default:
			throw InternalException("Don't know how to drop this type!");
		}
		break;
	case CatalogType::PREPARED_STATEMENT:
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
	case CatalogType::SCALAR_FUNCTION_ENTRY:
	case CatalogType::TABLE_FUNCTION_ENTRY:
	case CatalogType::COPY_FUNCTION_ENTRY:
	case CatalogType::PRAGMA_FUNCTION_ENTRY:
	case CatalogType::COLLATION_ENTRY:
	case CatalogType::DEPENDENCY_ENTRY:
	case CatalogType::SECRET_ENTRY:
	case CatalogType::SECRET_TYPE_ENTRY:
	case CatalogType::SECRET_FUNCTION_ENTRY:
		// do nothing, these entries are not persisted to disk
		break;
	default:
		throw InternalException("UndoBuffer - don't know how to write this entry to the WAL");
	}
}